

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

OptionBase<Kernel::PolyNf::SubtermIter> * __thiscall
Lib::OptionBase<Kernel::PolyNf::SubtermIter>::operator=
          (OptionBase<Kernel::PolyNf::SubtermIter> *this,
          OptionBase<Kernel::PolyNf::SubtermIter> *other)

{
  bool bVar1;
  Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> local_40;
  
  if (this->_isSome == true) {
    Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::~Stack
              ((Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)&this->_elem);
  }
  bVar1 = other->_isSome;
  if (bVar1 == true) {
    Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::Stack
              (&local_40,(Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)&other->_elem);
    Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::Stack
              ((Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_> *)&this->_elem,&local_40);
    Stack<Lib::BottomUpChildIter<Kernel::PolyNf>_>::~Stack(&local_40);
    bVar1 = other->_isSome;
  }
  this->_isSome = bVar1;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }